

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

ScriptFunctionWithInlineCache * __thiscall
Js::JavascriptLibrary::CreateScriptFunctionWithInlineCache
          (JavascriptLibrary *this,FunctionProxy *proxy)

{
  Type TVar1;
  ScriptFunctionType *deferredPrototypeType;
  Recycler *pRVar2;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_> *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  deferredPrototypeType = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  pRVar2 = this->recycler;
  if ((TVar1 >> 0x17 & 1) == 0) {
    if ((TVar1 >> 0x19 & 1) == 0) {
      local_50 = (undefined1  [8])&ScriptFunctionWithInlineCache::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x191a;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
                 *)new<(Memory::ObjectInfoBits)133>
                             (0x70,pRVar2,
                              (InfoBitsWrapper<(Memory::ObjectInfoBits)133> *)&data.field_0x27);
      ScriptFunctionWithInlineCache::ScriptFunctionWithInlineCache
                ((ScriptFunctionWithInlineCache *)this_00,proxy,deferredPrototypeType);
    }
    else {
      local_50 = (undefined1  [8])&FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x1916;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
                 *)new<(Memory::ObjectInfoBits)133>
                             (0x78,pRVar2,
                              (InfoBitsWrapper<(Memory::ObjectInfoBits)133> *)&data.field_0x27);
      FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::FunctionWithHomeObj
                ((FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache> *)this_00,proxy,
                 deferredPrototypeType);
    }
  }
  else if ((TVar1 >> 0x19 & 1) == 0) {
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x1918;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
               *)new<(Memory::ObjectInfoBits)133>
                           (0x78,pRVar2,
                            (InfoBitsWrapper<(Memory::ObjectInfoBits)133> *)&data.field_0x27);
    FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>::FunctionWithComputedName
              ((FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *)this_00,proxy,
               deferredPrototypeType);
  }
  else {
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x1912;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
               *)new<(Memory::ObjectInfoBits)133>
                           (0x80,pRVar2,
                            (InfoBitsWrapper<(Memory::ObjectInfoBits)133> *)&data.field_0x27);
    FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::
    FunctionWithComputedName(this_00,proxy,deferredPrototypeType);
  }
  return (ScriptFunctionWithInlineCache *)this_00;
}

Assistant:

ScriptFunctionWithInlineCache* JavascriptLibrary::CreateScriptFunctionWithInlineCache(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), FunctionWithComputedName<FunctionWithHomeObj<ScriptFunctionWithInlineCache>>, proxy, deferredPrototypeType);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), FunctionWithHomeObj<ScriptFunctionWithInlineCache>, proxy, deferredPrototypeType);
            }
            return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), ScriptFunctionWithInlineCacheAndComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), ScriptFunctionWithInlineCache, proxy, deferredPrototypeType);
    }